

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v_video.cpp
# Opt level: O1

void __thiscall DCanvas::CalcGamma(DCanvas *this,float gamma,BYTE *gammalookup)

{
  long lVar1;
  double dVar2;
  
  lVar1 = 0;
  do {
    dVar2 = pow((double)(int)lVar1 / 255.0,(double)(1.0 / gamma));
    gammalookup[lVar1] = (BYTE)(int)(dVar2 * 255.0);
    lVar1 = lVar1 + 1;
  } while (lVar1 != 0x100);
  return;
}

Assistant:

void DCanvas::CalcGamma (float gamma, BYTE gammalookup[256])
{
	// I found this formula on the web at
	// <http://panda.mostang.com/sane/sane-gamma.html>,
	// but that page no longer exits.

	double invgamma = 1.f / gamma;
	int i;

	for (i = 0; i < 256; i++)
	{
		gammalookup[i] = (BYTE)(255.0 * pow (i / 255.0, invgamma));
	}
}